

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O3

void free_notify_struct(void *input)

{
  int *piVar1;
  
  piVar1 = *(int **)((long)input + 0x58);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    free(*input);
    ixmlFreeDOMString(*(undefined8 *)((long)input + 8));
    free(*(void **)((long)input + 0x10));
    free(*(void **)((long)input + 0x18));
    free(*(void **)((long)input + 0x58));
  }
  free(input);
  return;
}

Assistant:

static void free_notify_struct(
	/*! [in] Notify structure. */
	void *input)
{
	notify_thread_struct *p = input;

	(*p->reference_count)--;
	if (*p->reference_count == 0) {
		free(p->headers);
		ixmlFreeDOMString(p->propertySet);
		free(p->servId);
		free(p->UDN);
		free(p->reference_count);
	}
	free(p);
}